

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Error_without_fee_asset_Test::
~CoinSelection_SelectCoins_Error_without_fee_asset_Test
          (CoinSelection_SelectCoins_Error_without_fee_asset_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Error_without_fee_asset_Test
            ((CoinSelection_SelectCoins_Error_without_fee_asset_Test *)0x28a9d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_without_fee_asset)
{
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 39060180;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb), CfdException);
}